

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O0

void __thiscall NJamSpell::TPerfectHash::Load(TPerfectHash *this,istream *in)

{
  bool *args_4;
  void *pvVar1;
  phf *perfHash;
  istream *in_local;
  TPerfectHash *this_local;
  
  Clear(this);
  pvVar1 = operator_new(0x38);
  memset(pvVar1,0,0x38);
  this->Phf = pvVar1;
  args_4 = (bool *)this->Phf;
  NHandyPack::
  Load<unsigned_long,phf::_unnamed_type_1_,unsigned_long,unsigned_long,unsigned_int,bool>
            (in,(unsigned_long *)(args_4 + 0x20),(anon_enum_32 *)(args_4 + 0x28),
             (unsigned_long *)(args_4 + 0x10),(unsigned_long *)(args_4 + 8),(uint *)(args_4 + 4),
             args_4);
  pvVar1 = calloc(*(size_t *)(args_4 + 8),4);
  *(void **)(args_4 + 0x18) = pvVar1;
  std::istream::read((char *)in,*(long *)(args_4 + 0x18));
  return;
}

Assistant:

void TPerfectHash::Load(std::istream& in) {
    Clear();
    Phf = new phf();
    phf& perfHash = *(phf*)Phf;
    NHandyPack::Load(in, perfHash.d_max,
                        perfHash.g_op,
                        perfHash.m,
                        perfHash.r,
                        perfHash.seed,
                        perfHash.nodiv);
    perfHash.g = (uint32_t*)calloc(perfHash.r, sizeof(uint32_t));
    in.read((char*)perfHash.g, perfHash.r * sizeof(uint32_t));
}